

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

bool __thiscall ON_BrepLoop::Read(ON_BrepLoop *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int i;
  ON__INT32 local_1c;
  
  bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_loop_index);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_ti);
    local_1c = 0;
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&local_1c);
      switch(local_1c) {
      case 0:
        this->m_type = unknown;
        break;
      case 1:
        this->m_type = outer;
        break;
      case 2:
        this->m_type = inner;
        break;
      case 3:
        this->m_type = slit;
      }
      if (!bVar1) {
        return false;
      }
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_fi);
      return bVar1;
    }
  }
  this->m_type = unknown;
  return false;
}

Assistant:

bool ON_BrepLoop::Read( ON_BinaryArchive& file )
{
  int i;
  bool rc = file.ReadInt( & m_loop_index );
  if (rc)
    rc = file.ReadArray( m_ti );

  i = unknown;
  if (rc)
    rc = file.ReadInt( &i );
  switch(i) {
  case unknown:
    m_type = unknown;
    break;
  case outer:
    m_type = outer;
    break;
  case inner:
    m_type = inner;
    break;
  case slit:
    m_type = slit;
    break;
  }

  if (rc)
    rc = file.ReadInt( &m_fi );
  return rc;
}